

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::handleProvide(capnp::rpc::Provide::Reader_const&)::
ProvidePipelineHook::~ProvidePipelineHook(ProvidePipelineHook *this)

{
  handleProvide::ProvidePipelineHook::~ProvidePipelineHook((ProvidePipelineHook *)(this + -8));
  return;
}

Assistant:

ProvidePipelineHook(kj::Own<void> awaiter): awaiter(kj::mv(awaiter)) {}